

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O3

void __thiscall Clasp::ScoreLook::scoreLits(ScoreLook *this,Solver *s,Literal *b,Literal *e)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  byte bVar5;
  pointer pVVar6;
  VarType VVar7;
  Literal *pLVar8;
  uint uVar9;
  Literal p;
  uint uVar10;
  uint sc;
  uint local_3c;
  VarVec *local_38;
  
  if (this->nant == false) {
    sc = (uint)((ulong)((long)e - (long)b) >> 2);
  }
  else if (b == e) {
    sc = 1;
  }
  else {
    sc = 1;
    pLVar8 = b;
    do {
      uVar10 = pLVar8->rep_ >> 2;
      uVar9 = 0;
      if (uVar10 < (s->shared_->varInfo_).ebo_.size) {
        uVar9 = (s->shared_->varInfo_).ebo_.buf[uVar10].rep >> 5 & 1;
      }
      sc = sc + uVar9;
      pLVar8 = pLVar8 + 1;
    } while (pLVar8 != e);
  }
  uVar9 = b->rep_;
  pVVar6 = (this->score).ebo_.buf;
  uVar10 = 0x3fff;
  if (sc < 0x3fff) {
    uVar10 = sc;
  }
  uVar1 = uVar10 << 0xe | 0x80000000;
  uVar2 = 0xf0003fff;
  if ((uVar9 & 2) == 0) {
    uVar1 = uVar10 | 0x40000000;
    uVar2 = 0xffffc000;
  }
  *(uint *)(&pVVar6->field_0x0 + (uVar9 & 0xfffffffc)) =
       uVar2 & *(uint *)(&pVVar6->field_0x0 + (uVar9 & 0xfffffffc)) | uVar1;
  if (this->addDeps == true) {
    uVar9 = uVar9 >> 2;
    if (((0xbfffffff < (uint)(this->score).ebo_.buf[uVar9]) || (this->mode == score_max)) &&
       (bVar3 = greater(this,uVar9,this->best), bVar3)) {
      this->best = uVar9;
    }
    if (b != e) {
      local_38 = &this->deps;
      do {
        p.rep_ = b->rep_;
        local_3c = p.rep_ >> 2;
        if (local_3c < (this->score).ebo_.size) {
          if (local_3c < (s->shared_->varInfo_).ebo_.size) {
            bVar5 = (s->shared_->varInfo_).ebo_.buf[local_3c].rep;
          }
          else {
            bVar5 = 0;
          }
          VVar7 = Body - ((bVar5 & 8) == 0);
          if ((bVar5 & 0x10) != 0) {
            VVar7 = Hybrid;
          }
          if ((this->types & VVar7) != 0) {
            pVVar6 = (this->score).ebo_.buf;
            uVar4 = (ulong)local_3c;
            if ((pVVar6[uVar4].field_0x3 & 0x30) == 0) {
              bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (local_38,&local_3c);
              uVar4 = (ulong)local_3c;
              pVVar6 = (this->score).ebo_.buf;
              p.rep_ = b->rep_;
            }
            VarScore::setDepScore(pVVar6 + uVar4,p,sc);
            pVVar6 = (this->score).ebo_.buf + local_3c;
            *pVVar6 = (VarScore)((uint)*pVVar6 | (b->rep_ & 2) * 0x8000000 + 0x10000000);
          }
        }
        b = b + 1;
      } while (b != e);
    }
  }
  return;
}

Assistant:

void ScoreLook::scoreLits(const Solver& s, const Literal* b, const Literal *e) {
	assert(b < e);
	uint32 sc = !nant ? uint32(e-b) : countNant(s, b, e);
	Var v     = b->var();
	assert(validVar(v));
	score[v].setScore(*b, sc);
	if (addDeps) {
		if ((score[v].testedBoth() || mode == score_max) && greater(v, best)) {
			best = v;
		}
		for (; b != e; ++b) {
			v = b->var();
			if (validVar(v) && (s.varInfo(v).type() & types) != 0) {
				if (!score[v].seen()) { deps.push_back(v); }
				score[v].setDepScore(*b, sc);
				score[v].setSeen(*b);
			}
		}
	}
}